

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v6::vprint(FILE *f,string_view format_str,format_args args)

{
  memory_buffer buffer;
  undefined **local_230;
  undefined1 *local_228;
  size_t local_220;
  ulong local_218;
  undefined1 local_210 [504];
  
  local_220 = 0;
  local_230 = &PTR_grow_001e4bb0;
  local_218 = 500;
  local_228 = local_210;
  vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
            ((range)&local_230,format_str,
             args.
             super_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
             ,(locale_ref)0x0);
  internal::fwrite_fully(local_228,1,local_220,f);
  local_230 = &PTR_grow_001e4bb0;
  if (local_228 != local_210) {
    operator_delete(local_228,local_218);
  }
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  internal::vformat_to(buffer, format_str,
                       basic_format_args<buffer_context<char>>(args));
  internal::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}